

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display_settings.c
# Opt level: O0

void al_set_new_display_option(int option,int value,int importance)

{
  ALLEGRO_EXTRA_DISPLAY_SETTINGS *pAVar1;
  byte bVar2;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  ALLEGRO_EXTRA_DISPLAY_SETTINGS *extras;
  
  pAVar1 = _al_get_new_display_settings();
  bVar2 = (byte)in_EDI;
  if (in_EDX == 0) {
    pAVar1->required = (1L << (bVar2 & 0x3f) ^ 0xffffffffffffffffU) & pAVar1->required;
    pAVar1->suggested = (1L << (bVar2 & 0x3f) ^ 0xffffffffffffffffU) & pAVar1->suggested;
  }
  else if (in_EDX == 1) {
    pAVar1->required = 1L << (bVar2 & 0x3f) | pAVar1->required;
    pAVar1->suggested = (1L << (bVar2 & 0x3f) ^ 0xffffffffffffffffU) & pAVar1->suggested;
  }
  else if (in_EDX == 2) {
    pAVar1->suggested = 1L << (bVar2 & 0x3f) | pAVar1->suggested;
    pAVar1->required = (1L << (bVar2 & 0x3f) ^ 0xffffffffffffffffU) & pAVar1->required;
  }
  pAVar1->settings[in_EDI] = in_ESI;
  return;
}

Assistant:

void al_set_new_display_option(int option, int value, int importance)
{
   ALLEGRO_EXTRA_DISPLAY_SETTINGS *extras;
   extras = _al_get_new_display_settings();
   switch (importance) {
      case ALLEGRO_REQUIRE:
         extras->required |= (int64_t)1 << option;
         extras->suggested &= ~((int64_t)1 << option);
         break;
      case ALLEGRO_SUGGEST:
         extras->suggested |= (int64_t)1 << option;
         extras->required &= ~((int64_t)1 << option);
         break;
      case ALLEGRO_DONTCARE:
         extras->required &= ~((int64_t)1 << option);
         extras->suggested &= ~((int64_t)1 << option);
         break;
   }
   extras->settings[option] = value;
}